

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O0

void __thiscall
OptionParser::parseReactOption
          (OptionParser *this,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  char *pcVar1;
  char *pcVar2;
  double dVar3;
  bool bVar4;
  size_type sVar5;
  InputError *pIVar6;
  string *psVar7;
  string local_268 [39];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [39];
  undefined1 local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  undefined1 local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  undefined1 local_89;
  string local_88 [32];
  double local_68;
  double value;
  string *tokens;
  allocator local_41;
  string local_40 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Network *network_local;
  OptionParser *this_local;
  
  local_20 = tokenList;
  tokenList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)network;
  network_local = (Network *)this;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokenList);
  if (sVar5 < 3) {
    tokens._3_1_ = 1;
    pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"",&local_41);
    InputError::InputError(pIVar6,2,(string *)local_40);
    tokens._3_1_ = 0;
    __cxa_throw(pIVar6,&InputError::typeinfo,InputError::~InputError);
  }
  value = (double)std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](local_20,0);
  bVar4 = Utilities::parseNumber<double>((string *)((long)value + 0x40),&local_68);
  dVar3 = value;
  pcVar1 = w_ORDER;
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
    bVar4 = Utilities::match((string *)dVar3,(string *)local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    dVar3 = value;
    pcVar2 = w_BULK;
    pcVar1 = w_GLOBAL;
    if (bVar4) {
      psVar7 = (string *)((long)value + 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,pcVar2,&local_d9);
      bVar4 = Utilities::match(psVar7,(string *)local_d8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      pcVar1 = w_WALL;
      if (bVar4) {
        Options::setOption((Options *)(tokenList_local + 0x17),BULK_ORDER,local_68);
      }
      else {
        psVar7 = (string *)((long)value + 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_100,pcVar1,&local_101);
        bVar4 = Utilities::match(psVar7,(string *)local_100);
        std::__cxx11::string::~string(local_100);
        std::allocator<char>::~allocator((allocator<char> *)&local_101);
        pcVar1 = w_TANK;
        if (bVar4) {
          Options::setOption((Options *)(tokenList_local + 0x17),WALL_ORDER,local_68);
        }
        else {
          psVar7 = (string *)((long)value + 0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_128,pcVar1,&local_129);
          bVar4 = Utilities::match(psVar7,(string *)local_128);
          std::__cxx11::string::~string(local_128);
          std::allocator<char>::~allocator((allocator<char> *)&local_129);
          if (!bVar4) {
            local_151 = 1;
            pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string(local_150,(string *)((long)value + 0x20));
            InputError::InputError(pIVar6,3,(string *)local_150);
            local_151 = 0;
            __cxa_throw(pIVar6,&InputError::typeinfo,InputError::~InputError);
          }
          Options::setOption((Options *)(tokenList_local + 0x17),TANK_ORDER,local_68);
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,pcVar1,&local_179);
      bVar4 = Utilities::match((string *)dVar3,(string *)local_178);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      dVar3 = value;
      pcVar2 = w_LIMITING;
      pcVar1 = w_BULK;
      if (bVar4) {
        psVar7 = (string *)((long)value + 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1a0,pcVar1,&local_1a1);
        bVar4 = Utilities::match(psVar7,(string *)local_1a0);
        std::__cxx11::string::~string(local_1a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
        pcVar1 = w_WALL;
        if (bVar4) {
          Options::setOption((Options *)(tokenList_local + 0x17),BULK_COEFF,local_68);
        }
        else {
          psVar7 = (string *)((long)value + 0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1c8,pcVar1,&local_1c9);
          bVar4 = Utilities::match(psVar7,(string *)local_1c8);
          std::__cxx11::string::~string(local_1c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
          if (!bVar4) {
            local_1f1 = 1;
            pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string(local_1f0,(string *)((long)value + 0x20));
            InputError::InputError(pIVar6,3,(string *)local_1f0);
            local_1f1 = 0;
            __cxa_throw(pIVar6,&InputError::typeinfo,InputError::~InputError);
          }
          Options::setOption((Options *)(tokenList_local + 0x17),WALL_COEFF,local_68);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_218,pcVar2,&local_219);
        bVar4 = Utilities::match((string *)dVar3,(string *)local_218);
        std::__cxx11::string::~string(local_218);
        std::allocator<char>::~allocator((allocator<char> *)&local_219);
        dVar3 = value;
        pcVar1 = w_ROUGHNESS;
        if (bVar4) {
          Options::setOption((Options *)(tokenList_local + 0x17),LIMITING_CONCEN,local_68);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_240,pcVar1,&local_241);
          bVar4 = Utilities::match((string *)dVar3,(string *)local_240);
          std::__cxx11::string::~string(local_240);
          std::allocator<char>::~allocator((allocator<char> *)&local_241);
          if (!bVar4) {
            pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string(local_268,(string *)value);
            InputError::InputError(pIVar6,3,(string *)local_268);
            __cxa_throw(pIVar6,&InputError::typeinfo,InputError::~InputError);
          }
          Options::setOption((Options *)(tokenList_local + 0x17),ROUGHNESS_FACTOR,local_68);
        }
      }
    }
    return;
  }
  local_89 = 1;
  pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_88,(string *)((long)value + 0x40));
  InputError::InputError(pIVar6,6,(string *)local_88);
  local_89 = 0;
  __cxa_throw(pIVar6,&InputError::typeinfo,InputError::~InputError);
}

Assistant:

void OptionParser::parseReactOption(Network* network, vector<string>& tokenList)
{
    // ... check for enough tokens

    if ( tokenList.size() < 3 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    // ... read reaction value (3rd token)

    double value;
    if ( !Utilities::parseNumber(tokens[2], value) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[2]);
    }

    // ... reaction order options

    if (Utilities::match(tokens[0], w_ORDER))
    {
        if (Utilities::match(tokens[1], w_BULK))
        {
            network->options.setOption(Options::BULK_ORDER, value);
        }
        else if (Utilities::match(tokens[1], w_WALL))
        {
            network->options.setOption(Options::WALL_ORDER, value);
        }
        else if (Utilities::match(tokens[1], w_TANK))
        {
            network->options.setOption(Options::TANK_ORDER, value);
        }
        else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);
    }

    // ... global reaction rate coeffs.

    else if (Utilities::match(tokens[0], w_GLOBAL))
    {
        if (Utilities::match(tokens[1], w_BULK))
        {
            network->options.setOption(Options::BULK_COEFF, value);
        }
        else if (Utilities::match(tokens[1], w_WALL))
        {
            network->options.setOption(Options::WALL_COEFF, value);
        }
        else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);
    }

    // ... limiting concentration option

    else if (Utilities::match(tokens[0], w_LIMITING))
    {
        network->options.setOption(Options::LIMITING_CONCEN, value);
    }

    // ... wall demand roughness correlation option

    else if (Utilities::match(tokens[0], w_ROUGHNESS))
    {
        network->options.setOption(Options::ROUGHNESS_FACTOR, value);
    }

    else throw InputError(InputError::INVALID_KEYWORD, tokens[0]);
}